

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::MethodDescriptorProto::MergeFrom
          (MethodDescriptorProto *this,MethodDescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  string *psVar3;
  string *psVar4;
  MethodOptions *this_00;
  Arena *pAVar5;
  MethodOptions *from_00;
  
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = (from->name_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar5 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
      }
      psVar4 = (this->name_).ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar5,psVar3);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = (from->input_type_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      pAVar5 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
      }
      psVar4 = (this->input_type_).ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->input_type_,pAVar5,psVar3);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
    }
    if ((uVar1 & 4) != 0) {
      psVar3 = (from->output_type_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 4;
      pAVar5 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
      }
      psVar4 = (this->output_type_).ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->output_type_,pAVar5,psVar3);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
    }
    if ((uVar1 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      this_00 = this->options_;
      if (this_00 == (MethodOptions *)0x0) {
        pAVar5 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
        }
        this_00 = Arena::CreateMaybeMessage<google::protobuf::MethodOptions>(pAVar5);
        this->options_ = this_00;
      }
      from_00 = (MethodOptions *)_MethodOptions_default_instance_;
      if (from->options_ != (MethodOptions *)0x0) {
        from_00 = from->options_;
      }
      MethodOptions::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 0x10) != 0) {
      this->client_streaming_ = from->client_streaming_;
    }
    if ((uVar1 & 0x20) != 0) {
      this->server_streaming_ = from->server_streaming_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void MethodDescriptorProto::MergeFrom(const MethodDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.MethodDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_input_type(from._internal_input_type());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_output_type(from._internal_output_type());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::MethodOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000010u) {
      client_streaming_ = from.client_streaming_;
    }
    if (cached_has_bits & 0x00000020u) {
      server_streaming_ = from.server_streaming_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}